

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O1

void add_help(QPDFArgParser *ap)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  pointer pcVar6;
  size_type __dnew_9;
  size_type __dnew;
  size_type __dnew_1;
  size_type __dnew_3;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  size_type local_38;
  
  paVar1 = &local_78.field_2;
  local_78.field_2._M_allocated_capacity._0_4_ = 0x67617375;
  local_78.field_2._M_local_buf[4] = 'e';
  local_78.field_2._M_local_buf[5] = '\0';
  local_78._M_string_length = 5;
  paVar2 = &local_b8.field_2;
  local_98._M_dataplus._M_p = (pointer)0x10;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"basic invocation",0x10);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x2b4;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Read a PDF file, apply transformations or modifications, and write\na new PDF file.\n\nUsage: qpdf [infile] [options] [outfile]\n   OR  qpdf --help[={topic|--option}]\n\n- infile, options, and outfile may be in any order as long as infile\n  precedes outfile.\n- Use --empty in place of an input file for a zero-page, empty input\n- Use --replace-input in place of an output file to overwrite the\n  input file with the output\n- outfile may be - to write to stdout; reading from stdin is not supported\n- @filename is an argument file; each line is treated as a separate\n  command-line argument\n- @- may be used to read arguments from stdin\n- Later options may override earlier options if contradictory\n"
         ,0x2b4);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6d652d2d;
  local_78.field_2._M_local_buf[4] = 'p';
  local_78.field_2._M_local_buf[5] = 't';
  local_78.field_2._M_local_buf[6] = 'y';
  local_78._M_string_length = 7;
  local_78.field_2._M_local_buf[7] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x67617375;
  local_b8.field_2._M_local_buf[4] = 'e';
  local_b8.field_2._M_local_buf[5] = '\0';
  local_b8._M_string_length = 5;
  local_58._M_dataplus._M_p = (pointer)0x17;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"use empty file as input",0x17);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_38 = 0x4b;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,"Use in place of infile for an empty input. Especially useful\nwith --pages.\n",0x4b
        );
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x65722d2d;
  local_78.field_2._M_local_buf[4] = 'p';
  local_78.field_2._M_local_buf[5] = 'l';
  local_78.field_2._M_local_buf[6] = 'a';
  local_78.field_2._M_local_buf[7] = 'c';
  local_78.field_2._M_local_buf[8] = 'e';
  local_78.field_2._M_local_buf[9] = '-';
  local_78.field_2._M_local_buf[10] = 'i';
  local_78.field_2._M_local_buf[0xb] = 'n';
  local_78.field_2._M_local_buf[0xc] = 'p';
  local_78.field_2._M_local_buf[0xd] = 'u';
  local_78.field_2._M_local_buf[0xe] = 't';
  local_78._M_string_length = 0xf;
  local_78.field_2._M_local_buf[0xf] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x67617375;
  local_b8.field_2._M_local_buf[4] = 'e';
  local_b8.field_2._M_local_buf[5] = '\0';
  local_b8._M_string_length = 5;
  local_58._M_dataplus._M_p = (pointer)0x1b;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"overwrite input with output",0x1b);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x45;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,"Use in place of outfile to overwrite the input file with the output.\n",0x45);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f6a2d2d;
  local_78.field_2._M_local_buf[4] = 'b';
  local_78.field_2._M_local_buf[5] = '-';
  local_78.field_2._M_local_buf[6] = 'j';
  local_78.field_2._M_local_buf[7] = 's';
  local_78.field_2._M_local_buf[8] = 'o';
  local_78.field_2._M_local_buf[9] = 'n';
  local_78.field_2._M_local_buf[10] = '-';
  local_78.field_2._M_local_buf[0xb] = 'f';
  local_78.field_2._M_local_buf[0xc] = 'i';
  local_78.field_2._M_local_buf[0xd] = 'l';
  local_78.field_2._M_local_buf[0xe] = 'e';
  local_78._M_string_length = 0xf;
  local_78.field_2._M_local_buf[0xf] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x67617375;
  local_b8.field_2._M_local_buf[4] = 'e';
  local_b8.field_2._M_local_buf[5] = '\0';
  local_b8._M_string_length = 5;
  local_98.field_2._M_allocated_capacity._0_5_ = 0x4a20626f6a;
  local_98.field_2._M_allocated_capacity._5_3_ = 0x4e4f53;
  local_98.field_2._8_4_ = 0x6c696620;
  local_98.field_2._M_local_buf[0xc] = 'e';
  local_98._M_string_length = 0xd;
  local_98.field_2._M_local_buf[0xd] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xb7;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--job-json-file=file\n\nSpecify the name of a file whose contents are expected to\ncontain a QPDFJob JSON file. Run qpdf --job-json-help for a\ndescription of the JSON input file format.\n"
         ,0xb7);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x74697865;
  local_78.field_2._M_local_buf[4] = '-';
  local_78.field_2._M_local_buf[5] = 's';
  local_78.field_2._M_local_buf[6] = 't';
  local_78.field_2._M_local_buf[7] = 'a';
  local_78.field_2._M_local_buf[8] = 't';
  local_78.field_2._M_local_buf[9] = 'u';
  local_78.field_2._M_local_buf[10] = 's';
  local_78._M_string_length = 0xb;
  local_78.field_2._M_local_buf[0xb] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98._M_dataplus._M_p = (pointer)0x1d;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"meanings of qpdf\'s exit codes",0x1d);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0xcd;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Meaning of exit codes:\n\n- 0: no errors or warnings\n- 1: not used by qpdf but may be used by the shell if unable to invoke qpdf\n- 2: errors detected\n- 3: warnings detected, unless --warning-exit-0 is given\n"
         ,0xcd);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x10;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--warning-exit-0",0x10);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x74697865;
  local_b8.field_2._M_local_buf[4] = '-';
  local_b8.field_2._M_local_buf[5] = 's';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'a';
  local_b8.field_2._8_2_ = 0x7574;
  local_b8.field_2._M_local_buf[10] = 's';
  local_b8._M_string_length = 0xb;
  local_b8.field_2._M_local_buf[0xb] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x19;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"exit 0 even with warnings",0x19);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x79;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Use exit status 0 instead of 3 when warnings are present. When\ncombined with --no-warn, warnings are completely ignored.\n"
         ,0x79);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x706d6f63;
  local_78.field_2._M_local_buf[4] = 'l';
  local_78.field_2._M_local_buf[5] = 'e';
  local_78.field_2._M_local_buf[6] = 't';
  local_78.field_2._M_local_buf[7] = 'i';
  local_78.field_2._M_local_buf[8] = 'o';
  local_78.field_2._M_local_buf[9] = 'n';
  local_78._M_string_length = 10;
  local_78.field_2._M_local_buf[10] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98._M_dataplus._M_p = (pointer)0x10;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"shell completion",0x10);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0xe0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Shell completion is supported with bash and zsh. Use\neval $(qpdf --completion-bash) or eval $(qpdf --completion-zsh)\nto enable. The QPDF_EXECUTABLE environment variable overrides the\npath to qpdf that these commands output.\n"
         ,0xe0);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x11;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--completion-bash",0x11);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706d6f63;
  local_b8.field_2._M_local_buf[4] = 'l';
  local_b8.field_2._M_local_buf[5] = 'e';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'i';
  local_b8.field_2._8_2_ = 0x6e6f;
  local_b8._M_string_length = 10;
  local_b8.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x16;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"enable bash completion",0x16);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x2e;
  local_58._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_58.field_2._M_allocated_capacity = local_38;
  builtin_strncpy(local_58._M_dataplus._M_p,"Output a command that enables bash completion\n",0x2e);
  local_58._M_string_length = local_38;
  local_58._M_dataplus._M_p[local_38] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x10;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--completion-zsh",0x10);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706d6f63;
  local_b8.field_2._M_local_buf[4] = 'l';
  local_b8.field_2._M_local_buf[5] = 'e';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'i';
  local_b8.field_2._8_2_ = 0x6e6f;
  local_b8._M_string_length = 10;
  local_b8.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x15;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"enable zsh completion",0x15);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x2d;
  local_58._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_58.field_2._M_allocated_capacity = local_38;
  builtin_strncpy(local_58._M_dataplus._M_p,"Output a command that enables zsh completion\n",0x2d);
  local_58._M_string_length = local_38;
  local_58._M_dataplus._M_p[local_38] = '\0';
  paVar3 = &local_b8.field_2;
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x706c6568;
  local_78._M_string_length = 4;
  local_78.field_2._M_local_buf[4] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x16;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"information about qpdf",0x16);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x82;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Help options provide some information about qpdf itself. Help\noptions are only valid as the first and only command-line argument.\n"
         ,0x82);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x65682d2d;
  local_78.field_2._M_local_buf[4] = 'l';
  local_78.field_2._M_local_buf[5] = 'p';
  local_78._M_string_length = 6;
  local_78.field_2._M_local_buf[6] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706c6568;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_98.field_2._M_allocated_capacity._0_5_ = 0x69766f7270;
  local_98.field_2._M_allocated_capacity._5_3_ = 0x206564;
  local_98.field_2._8_4_ = 0x706c6568;
  local_98._M_string_length = 0xc;
  local_98.field_2._M_local_buf[0xc] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xab;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--help[=--option|topic]\n\n--help: provide general information and a list of topics\n--help=--option: provide help on a specific option\n--help=topic: provide help on a topic\n"
         ,0xab);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x65762d2d;
  local_78.field_2._M_local_buf[4] = 'r';
  local_78.field_2._M_local_buf[5] = 's';
  local_78.field_2._M_local_buf[6] = 'i';
  local_78.field_2._M_local_buf[7] = 'o';
  local_78.field_2._M_local_buf[8] = 'n';
  local_78.field_2._M_local_buf[9] = '\0';
  local_78._M_string_length = 9;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706c6568;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x11;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"show qpdf version",0x11);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x1d;
  local_58._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_58.field_2._M_allocated_capacity = local_38;
  builtin_strncpy(local_58._M_dataplus._M_p,"Display the version of qpdf.\n",0x1d);
  local_58._M_string_length = local_38;
  local_58._M_dataplus._M_p[local_38] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f632d2d;
  local_78.field_2._M_local_buf[4] = 'p';
  local_78.field_2._M_local_buf[5] = 'y';
  local_78.field_2._M_local_buf[6] = 'r';
  local_78.field_2._M_local_buf[7] = 'i';
  local_78.field_2._M_local_buf[8] = 'g';
  local_78.field_2._M_local_buf[9] = 'h';
  local_78.field_2._M_local_buf[10] = 't';
  local_78._M_string_length = 0xb;
  local_78.field_2._M_local_buf[0xb] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706c6568;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1a;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"show copyright information",0x1a);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x2b;
  local_58._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_58.field_2._M_allocated_capacity = local_38;
  builtin_strncpy(local_58._M_dataplus._M_p,"Display copyright and license information.\n",0x2b);
  local_58._M_string_length = local_38;
  local_58._M_dataplus._M_p[local_38] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x68732d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'w';
  local_78.field_2._M_local_buf[6] = '-';
  local_78.field_2._M_local_buf[7] = 'c';
  local_78.field_2._M_local_buf[8] = 'r';
  local_78.field_2._M_local_buf[9] = 'y';
  local_78.field_2._M_local_buf[10] = 'p';
  local_78.field_2._M_local_buf[0xb] = 't';
  local_78.field_2._M_local_buf[0xc] = 'o';
  local_78._M_string_length = 0xd;
  local_78.field_2._M_local_buf[0xd] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706c6568;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1f;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"show available crypto providers",0x1f);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x5e;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Show a list of available crypto providers, one per line. The\ndefault provider is shown first.\n"
         ,0x5e);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f6a2d2d;
  local_78.field_2._M_local_buf[4] = 'b';
  local_78.field_2._M_local_buf[5] = '-';
  local_78.field_2._M_local_buf[6] = 'j';
  local_78.field_2._M_local_buf[7] = 's';
  local_78.field_2._M_local_buf[8] = 'o';
  local_78.field_2._M_local_buf[9] = 'n';
  local_78.field_2._M_local_buf[10] = '-';
  local_78.field_2._M_local_buf[0xb] = 'h';
  local_78.field_2._M_local_buf[0xc] = 'e';
  local_78.field_2._M_local_buf[0xd] = 'l';
  local_78.field_2._M_local_buf[0xe] = 'p';
  local_78._M_string_length = 0xf;
  local_78.field_2._M_local_buf[0xf] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706c6568;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x17;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"show format of job JSON",0x17);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x47;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,"Describe the format of the QPDFJob JSON input used by\n--job-json-file.\n",0x47);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f7a2d2d;
  local_78.field_2._M_local_buf[4] = 'p';
  local_78.field_2._M_local_buf[5] = 'f';
  local_78.field_2._M_local_buf[6] = 'l';
  local_78.field_2._M_local_buf[7] = 'i';
  local_78._M_string_length = 8;
  local_78.field_2._M_local_buf[8] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x706c6568;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x2d;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"indicate whether zopfli is enabled and active",0x2d);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xfc;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "If zopfli support is compiled in, indicate whether it is active,\nand exit normally. Otherwise, indicate that it is not compiled\nin, and exit with an error code. If zopfli is compiled in,\nactivate it by setting the ``QPDF_ZOPFLI`` environment variable.\n"
         ,0xfc);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x656e6567;
  local_78.field_2._M_local_buf[4] = 'r';
  local_78.field_2._M_local_buf[5] = 'a';
  local_78.field_2._M_local_buf[6] = 'l';
  local_78._M_string_length = 7;
  local_78.field_2._M_local_buf[7] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x656e6567;
  local_b8.field_2._M_local_buf[4] = 'r';
  local_b8.field_2._M_local_buf[5] = 'a';
  local_b8.field_2._M_local_buf[6] = 'l';
  local_b8.field_2._M_local_buf[7] = ' ';
  local_b8.field_2._8_2_ = 0x706f;
  local_b8.field_2._M_local_buf[10] = 't';
  local_b8.field_2._M_local_buf[0xb] = 'i';
  local_b8.field_2._12_2_ = 0x6e6f;
  local_b8.field_2._M_local_buf[0xe] = 's';
  local_b8._M_string_length = 0xf;
  local_b8.field_2._M_local_buf[0xf] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x71;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "General options control qpdf\'s behavior in ways that are not\ndirectly related to the operation it is performing.\n"
         ,0x71);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x61702d2d;
  local_78.field_2._M_local_buf[4] = 's';
  local_78.field_2._M_local_buf[5] = 's';
  local_78.field_2._M_local_buf[6] = 'w';
  local_78.field_2._M_local_buf[7] = 'o';
  local_78.field_2._M_local_buf[8] = 'r';
  local_78.field_2._M_local_buf[9] = 'd';
  local_78._M_string_length = 10;
  local_78.field_2._M_local_buf[10] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x656e6567;
  local_b8.field_2._M_local_buf[4] = 'r';
  local_b8.field_2._M_local_buf[5] = 'a';
  local_b8.field_2._M_local_buf[6] = 'l';
  local_b8._M_string_length = 7;
  local_b8.field_2._M_local_buf[7] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1b;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"password for encrypted file",0x1b);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x86;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--password=password\n\nSpecify a password for an encrypted, password-protected file.\nNot needed for encrypted files without a password.\n"
         ,0x86);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x61702d2d;
  local_78.field_2._M_local_buf[4] = 's';
  local_78.field_2._M_local_buf[5] = 's';
  local_78.field_2._M_local_buf[6] = 'w';
  local_78.field_2._M_local_buf[7] = 'o';
  local_78.field_2._M_local_buf[8] = 'r';
  local_78.field_2._M_local_buf[9] = 'd';
  local_78.field_2._M_local_buf[10] = '-';
  local_78.field_2._M_local_buf[0xb] = 'f';
  local_78.field_2._M_local_buf[0xc] = 'i';
  local_78.field_2._M_local_buf[0xd] = 'l';
  local_78.field_2._M_local_buf[0xe] = 'e';
  local_78._M_string_length = 0xf;
  local_78.field_2._M_local_buf[0xf] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x656e6567;
  local_b8.field_2._M_local_buf[4] = 'r';
  local_b8.field_2._M_local_buf[5] = 'a';
  local_b8.field_2._M_local_buf[6] = 'l';
  local_b8._M_string_length = 7;
  local_b8.field_2._M_local_buf[7] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x19;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"read password from a file",0x19);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x88;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--password-file=filename\n\nThe first line of the specified file is used as the password.\nThis is used in place of the --password option.\n"
         ,0x88);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  add_help_2(ap);
  add_help_3(ap);
  add_help_4(ap);
  add_help_5(ap);
  local_b8._M_dataplus._M_p = (pointer)0x10;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--allow-insecure",0x10);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x72636e65;
  local_b8.field_2._M_local_buf[4] = 'y';
  local_b8.field_2._M_local_buf[5] = 'p';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'i';
  local_b8.field_2._8_2_ = 0x6e6f;
  local_b8._M_string_length = 10;
  local_b8.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1b;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"allow empty owner passwords",0x1b);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x73;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Allow creation of PDF files with empty owner passwords and\nnon-empty user passwords when using 256-bit encryption.\n"
         ,0x73);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f662d2d;
  local_78.field_2._M_local_buf[4] = 'r';
  local_78.field_2._M_local_buf[5] = 'c';
  local_78.field_2._M_local_buf[6] = 'e';
  local_78.field_2._M_local_buf[7] = '-';
  local_78.field_2._M_local_buf[8] = 'V';
  local_78.field_2._M_local_buf[9] = '4';
  local_78._M_string_length = 10;
  local_78.field_2._M_local_buf[10] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x72636e65;
  local_b8.field_2._M_local_buf[4] = 'y';
  local_b8.field_2._M_local_buf[5] = 'p';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'i';
  local_b8.field_2._8_2_ = 0x6e6f;
  local_b8._M_string_length = 10;
  local_b8.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x22;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"force V=4 in encryption dictionary",0x22);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x6b;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "This option is for testing and is never needed in practice since\nqpdf does this automatically when needed.\n"
         ,0x6b);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f662d2d;
  local_78.field_2._M_local_buf[4] = 'r';
  local_78.field_2._M_local_buf[5] = 'c';
  local_78.field_2._M_local_buf[6] = 'e';
  local_78.field_2._M_local_buf[7] = '-';
  local_78.field_2._M_local_buf[8] = 'R';
  local_78.field_2._M_local_buf[9] = '5';
  local_78._M_string_length = 10;
  local_78.field_2._M_local_buf[10] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x72636e65;
  local_b8.field_2._M_local_buf[4] = 'y';
  local_b8.field_2._M_local_buf[5] = 'p';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'i';
  local_b8.field_2._8_2_ = 0x6e6f;
  local_b8._M_string_length = 10;
  local_b8.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1e;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"use unsupported R=5 encryption",0x1e);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xac;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Use an undocumented, unsupported, deprecated encryption\nalgorithm that existed only in Acrobat version IX. This option\nshould not be used except for compatibility testing.\n"
         ,0xac);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  paVar2 = &local_b8.field_2;
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x65676170;
  local_78.field_2._M_local_buf[4] = '-';
  local_78.field_2._M_local_buf[5] = 's';
  local_78.field_2._M_local_buf[6] = 'e';
  local_78.field_2._M_local_buf[7] = 'l';
  local_78.field_2._M_local_buf[8] = 'e';
  local_78.field_2._M_local_buf[9] = 'c';
  local_78.field_2._M_local_buf[10] = 't';
  local_78.field_2._M_local_buf[0xb] = 'i';
  local_78.field_2._M_local_buf[0xc] = 'o';
  local_78.field_2._M_local_buf[0xd] = 'n';
  local_78._M_string_length = 0xe;
  local_78.field_2._M_local_buf[0xe] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x23;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"select pages from one or more files",0x23);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x83f;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Use the --pages option to select pages from multiple files. Usage:\n\nqpdf in.pdf --pages --file=input-file \\\n    [--range=page-range] [--password=password] [...] -- out.pdf\n\nOR\n\nqpdf in.pdf --pages input-file [--password=password] [page-range] \\\n    [...] -- out.pdf\n\nBetween --pages and the -- that terminates pages option, repeat\nthe following:\n\n--file=filename [--range=page-range] [--password=password] [options]\n\nFor compatibility, the file and range can be specified\npositionally. qpdf versions prior to 11.9.0\nrequire --password=password to immediately follow the filename. In\nthe older syntax, repeat the following:\n\nfilename [--password=password] [page-range]\n\nDocument-level information, such as outlines, tags, etc., is taken\nfrom in.pdf and is preserved in out.pdf. You can use --empty in place\nof an input file to start from an empty file and just copy pages\nequally from all files. You can use \".\" as a shorthand for the\nprimary input file (if not --empty). In the above example, \".\"\nwould refer to in.pdf.\n\nUse --password=password to specify the password for a\npassword-protected input file. If the same input file is used more\nthan once, you only need to supply the password the first time. If\nthe page range is omitted, all pages are selected.\n\nRun qpdf --help=page-ranges for help with page ranges.\n\nUse --collate=n to cause pages to be collated in groups of n pages\n(default 1) instead of concatenating the input.\nUse --collate=i,j,k,... to take i from the first, then j from the\nsecond, then k from the third, then i from the first, etc.\n\nExamples:\n\n- Start with in.pdf and append all pages from a.pdf and the even\n  pages from b.pdf, and write the output to out.pdf. Document-level\n  information from in.pdf is retained. Note the use of \".\" to refer\n  to in.pdf.\n\n  qpdf in.pdf --pages . a.pdf b.pdf 1-z:even -- out.pdf\n\n- Take all the pages from a.pdf, all the pages from b.pdf in\n  reverse, and only pages 3 and 6 from c.pdf and write the result\n  to out.pdf. Use password \"x\" to open b.pdf:\n\n  qpdf --empty --pages a.pdf b.pd..." /* TRUNCATED STRING LITERAL */
         ,0x83f);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x10;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"overlay-underlay",0x10);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x2b;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"overlay/underlay pages from other PDF files",0x2b);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x43c;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "These options allow pages from another PDF file to be overlaid or\nunderlaid on the primary output. Overlaid pages are drawn on top of\nthe destination page and may obscure the page. Underlaid pages are\ndrawn below the destination page. Usage:\n\n{--overlay|--underlay} [--file=]file\n      [--password=password]\n      [--to=page-range]\n      [--from=[page-range]]\n      [--repeat=page-range]\n      --\n\nNote the use of \"--\" by itself to terminate overlay/underlay options.\n\nFor overlay and underlay, a file and optional password are specified, along\nwith a series of optional page ranges. The default behavior is that each\npage of the overlay or underlay file is imposed on the corresponding page\nof the primary output until it runs out of pages, and any extra pages are\nignored. You can also give a page range with --repeat to cause\nthose pages to be repeated after the original pages are exhausted.\n\nThis options are repeatable. Pages will be stacked in order of\nappearance: first underlays, then the original page, then overlays.\n\nRun qpdf --help=page-ranges for help with page ranges.\n"
         ,0x43c);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f742d2d;
  local_78._M_string_length = 4;
  local_78.field_2._M_local_buf[4] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x10;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"overlay-underlay",0x10);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x26;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"destination pages for underlay/overlay",0x26);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xa1;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--to=page-range\n\nSpecify the range of pages in the primary output to apply\noverlay/underlay to. See qpdf --help=page-ranges for help with\nthe page range syntax.\n"
         ,0xa1);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x72662d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'm';
  local_78._M_string_length = 6;
  local_78.field_2._M_local_buf[6] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x10;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"overlay-underlay",0x10);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x21;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"source pages for underlay/overlay",0x21);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xe1;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--from=[page-range]\n\nSpecify pages from the overlay/underlay file that are applied to\nthe destination pages. See qpdf --help=page-ranges for help\nwith the page range syntax. The page range may be omitted\nif --repeat is used.\n"
         ,0xe1);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x65722d2d;
  local_78.field_2._M_local_buf[4] = 'p';
  local_78.field_2._M_local_buf[5] = 'e';
  local_78.field_2._M_local_buf[6] = 'a';
  local_78.field_2._M_local_buf[7] = 't';
  local_78._M_string_length = 8;
  local_78.field_2._M_local_buf[8] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x10;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"overlay-underlay",0x10);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x20;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"overlay/underlay pages to repeat",0x20);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xb8;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--repeat=page-range\n\nSpecify pages from the overlay/underlay that are repeated after\n\"from\" pages have been exhausted. See qpdf --help=page-ranges\nfor help with the page range syntax.\n"
         ,0xb8);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x61747461;
  local_78.field_2._M_local_buf[4] = 'c';
  local_78.field_2._M_local_buf[5] = 'h';
  local_78.field_2._M_local_buf[6] = 'm';
  local_78.field_2._M_local_buf[7] = 'e';
  local_78.field_2._M_local_buf[8] = 'n';
  local_78.field_2._M_local_buf[9] = 't';
  local_78.field_2._M_local_buf[10] = 's';
  local_78._M_string_length = 0xb;
  local_78.field_2._M_local_buf[0xb] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x18;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"work with embedded files",0x18);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x139;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "It is possible to list, add, or delete embedded files (also known\nas attachments) and to copy attachments from other files. See help\non individual options for details. Run qpdf --help=add-attachment\nfor additional details about adding attachments. See also\n--help=--list-attachments and --help=--show-attachment.\n"
         ,0x139);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x10;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--add-attachment",0x10);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x61747461;
  local_b8.field_2._M_local_buf[4] = 'c';
  local_b8.field_2._M_local_buf[5] = 'h';
  local_b8.field_2._M_local_buf[6] = 'm';
  local_b8.field_2._M_local_buf[7] = 'e';
  local_b8.field_2._8_2_ = 0x746e;
  local_b8.field_2._M_local_buf[10] = 's';
  local_b8._M_string_length = 0xb;
  local_b8.field_2._M_local_buf[0xb] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1c;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"start add attachment options",0x1c);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xa7;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--add-attachment file [options] --\n\nThe --add-attachment flag and its options may be repeated to add\nmultiple attachments. Run qpdf --help=add-attachment for details.\n"
         ,0xa7);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x17;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--copy-attachments-from",0x17);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x61747461;
  local_b8.field_2._M_local_buf[4] = 'c';
  local_b8.field_2._M_local_buf[5] = 'h';
  local_b8.field_2._M_local_buf[6] = 'm';
  local_b8.field_2._M_local_buf[7] = 'e';
  local_b8.field_2._8_2_ = 0x746e;
  local_b8.field_2._M_local_buf[10] = 's';
  local_b8._M_string_length = 0xb;
  local_b8.field_2._M_local_buf[0xb] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1d;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"start copy attachment options",0x1d);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xc3;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--copy-attachments-from file [options] --\n\nThe --copy-attachments-from flag and its options may be repeated\nto copy attachments from multiple files. Run\nqpdf --help=copy-attachments for details.\n"
         ,0xc3);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x13;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--remove-attachment",0x13);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x61747461;
  local_b8.field_2._M_local_buf[4] = 'c';
  local_b8.field_2._M_local_buf[5] = 'h';
  local_b8.field_2._M_local_buf[6] = 'm';
  local_b8.field_2._M_local_buf[7] = 'e';
  local_b8.field_2._8_2_ = 0x746e;
  local_b8.field_2._M_local_buf[10] = 's';
  local_b8._M_string_length = 0xb;
  local_b8.field_2._M_local_buf[0xb] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x17;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"remove an embedded file",0x17);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x65;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--remove-attachment=key\n\nRemove an embedded file using its key. Get the key with\n--list-attachments.\n"
         ,0x65);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x2d666470;
  local_78.field_2._M_local_buf[4] = 'd';
  local_78.field_2._M_local_buf[5] = 'a';
  local_78.field_2._M_local_buf[6] = 't';
  local_78.field_2._M_local_buf[7] = 'e';
  local_78.field_2._M_local_buf[8] = 's';
  local_78.field_2._M_local_buf[9] = '\0';
  local_78._M_string_length = 9;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x20464450;
  local_b8.field_2._M_local_buf[4] = 'd';
  local_b8.field_2._M_local_buf[5] = 'a';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'e';
  local_b8.field_2._8_2_ = 0x6620;
  local_b8.field_2._M_local_buf[10] = 'o';
  local_b8.field_2._M_local_buf[0xb] = 'r';
  local_b8.field_2._12_2_ = 0x616d;
  local_b8.field_2._M_local_buf[0xe] = 't';
  local_b8._M_string_length = 0xf;
  local_b8.field_2._M_local_buf[0xf] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x242;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "When a date is required, the date should conform to the PDF date\nformat specification, which is \"D:yyyymmddhhmmssz\" where \"z\" is\neither literally upper case \"Z\" for UTC or a timezone offset in\nthe form \"-hh\'mm\'\" or \"+hh\'mm\'\". Negative timezone offsets indicate\ntime before UTC. Positive offsets indicate how far after. For\nexample, US Eastern Standard Time (America/New_York) is \"-05\'00\'\",\nand Indian Standard Time (Asia/Calcutta) is \"+05\'30\'\".\n\nExamples:\n- D:20210207161528-05\'00\'   February 7, 2021 at 4:15:28 p.m.\n- D:20210207211528Z         February 7, 2021 at 21:15:28 UTC\n"
         ,0x242);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x2d646461;
  local_78.field_2._M_local_buf[4] = 'a';
  local_78.field_2._M_local_buf[5] = 't';
  local_78.field_2._M_local_buf[6] = 't';
  local_78.field_2._M_local_buf[7] = 'a';
  local_78.field_2._M_local_buf[8] = 'c';
  local_78.field_2._M_local_buf[9] = 'h';
  local_78.field_2._M_local_buf[10] = 'm';
  local_78.field_2._M_local_buf[0xb] = 'e';
  local_78.field_2._M_local_buf[0xc] = 'n';
  local_78.field_2._M_local_buf[0xd] = 't';
  local_78._M_string_length = 0xe;
  local_78.field_2._M_local_buf[0xe] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x14;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"attach (embed) files",0x14);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x53;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "The options listed below appear between --add-attachment and its\nterminating \"--\".\n",
         0x53);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x656b2d2d;
  local_78.field_2._M_local_buf[4] = 'y';
  local_78.field_2._M_local_buf[5] = '\0';
  local_78._M_string_length = 5;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x2d646461;
  local_b8.field_2._M_local_buf[4] = 'a';
  local_b8.field_2._M_local_buf[5] = 't';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'a';
  local_b8.field_2._8_2_ = 0x6863;
  local_b8.field_2._M_local_buf[10] = 'm';
  local_b8.field_2._M_local_buf[0xb] = 'e';
  local_b8.field_2._12_2_ = 0x746e;
  local_b8._M_string_length = 0xe;
  local_b8.field_2._M_local_buf[0xe] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x16;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"specify attachment key",0x16);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x9e;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--key=key\n\nSpecify the key to use for the attachment in the embedded files\ntable. It defaults to the last element (basename) of the\nattached file\'s filename.\n"
         ,0x9e);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x69662d2d;
  local_78.field_2._M_local_buf[4] = 'l';
  local_78.field_2._M_local_buf[5] = 'e';
  local_78.field_2._M_local_buf[6] = 'n';
  local_78.field_2._M_local_buf[7] = 'a';
  local_78.field_2._M_local_buf[8] = 'm';
  local_78.field_2._M_local_buf[9] = 'e';
  local_78._M_string_length = 10;
  local_78.field_2._M_local_buf[10] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x2d646461;
  local_b8.field_2._M_local_buf[4] = 'a';
  local_b8.field_2._M_local_buf[5] = 't';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'a';
  local_b8.field_2._8_2_ = 0x6863;
  local_b8.field_2._M_local_buf[10] = 'm';
  local_b8.field_2._M_local_buf[0xb] = 'e';
  local_b8.field_2._12_2_ = 0x746e;
  local_b8._M_string_length = 0xe;
  local_b8.field_2._M_local_buf[0xe] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x23;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"set attachment\'s displayed filename",0x23);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x107;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--filename=name\n\nSpecify the filename to be used for the attachment. This is what\nis usually displayed to the user and is the name most graphical\nPDF viewers will use when saving a file. It defaults to the last\nelement (basename) of the attached file\'s filename.\n"
         ,0x107);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x72632d2d;
  local_78.field_2._M_local_buf[4] = 'e';
  local_78.field_2._M_local_buf[5] = 'a';
  local_78.field_2._M_local_buf[6] = 't';
  local_78.field_2._M_local_buf[7] = 'i';
  local_78.field_2._M_local_buf[8] = 'o';
  local_78.field_2._M_local_buf[9] = 'n';
  local_78.field_2._M_local_buf[10] = 'd';
  local_78.field_2._M_local_buf[0xb] = 'a';
  local_78.field_2._M_local_buf[0xc] = 't';
  local_78.field_2._M_local_buf[0xd] = 'e';
  local_78._M_string_length = 0xe;
  local_78.field_2._M_local_buf[0xe] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x2d646461;
  local_b8.field_2._M_local_buf[4] = 'a';
  local_b8.field_2._M_local_buf[5] = 't';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'a';
  local_b8.field_2._8_2_ = 0x6863;
  local_b8.field_2._M_local_buf[10] = 'm';
  local_b8.field_2._M_local_buf[0xb] = 'e';
  local_b8.field_2._12_2_ = 0x746e;
  local_b8._M_string_length = 0xe;
  local_b8.field_2._M_local_buf[0xe] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1e;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"set attachment\'s creation date",0x1e);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xaa;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--creationdate=date\n\nSpecify the attachment\'s creation date in PDF format; defaults\nto the current time. Run qpdf --help=pdf-dates for information\nabout the date format.\n"
         ,0xaa);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6f6d2d2d;
  local_78.field_2._M_local_buf[4] = 'd';
  local_78.field_2._M_local_buf[5] = 'd';
  local_78.field_2._M_local_buf[6] = 'a';
  local_78.field_2._M_local_buf[7] = 't';
  local_78.field_2._M_local_buf[8] = 'e';
  local_78.field_2._M_local_buf[9] = '\0';
  local_78._M_string_length = 9;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x2d646461;
  local_b8.field_2._M_local_buf[4] = 'a';
  local_b8.field_2._M_local_buf[5] = 't';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'a';
  local_b8.field_2._8_2_ = 0x6863;
  local_b8.field_2._M_local_buf[10] = 'm';
  local_b8.field_2._M_local_buf[0xb] = 'e';
  local_b8.field_2._12_2_ = 0x746e;
  local_b8._M_string_length = 0xe;
  local_b8.field_2._M_local_buf[0xe] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x22;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"set attachment\'s modification date",0x22);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xa9;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--moddate=date\n\nSpecify the attachment\'s modification date in PDF format;\ndefaults to the current time. Run qpdf --help=pdf-dates for\ninformation about the date format.\n"
         ,0xa9);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x696d2d2d;
  local_78.field_2._M_local_buf[4] = 'm';
  local_78.field_2._M_local_buf[5] = 'e';
  local_78.field_2._M_local_buf[6] = 't';
  local_78.field_2._M_local_buf[7] = 'y';
  local_78.field_2._M_local_buf[8] = 'p';
  local_78.field_2._M_local_buf[9] = 'e';
  local_78._M_string_length = 10;
  local_78.field_2._M_local_buf[10] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x2d646461;
  local_b8.field_2._M_local_buf[4] = 'a';
  local_b8.field_2._M_local_buf[5] = 't';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'a';
  local_b8.field_2._8_2_ = 0x6863;
  local_b8.field_2._M_local_buf[10] = 'm';
  local_b8.field_2._M_local_buf[0xb] = 'e';
  local_b8.field_2._12_2_ = 0x746e;
  local_b8._M_string_length = 0xe;
  local_b8.field_2._M_local_buf[0xe] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x2a;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"attachment mime type, e.g. application/pdf",0x2a);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x78;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--mimetype=type/subtype\n\nSpecify the mime type for the attachment, such as text/plain,\napplication/pdf, image/png, etc.\n"
         ,0x78);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  add_help_7(ap);
  local_b8._M_dataplus._M_p = (pointer)0x12;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--list-attachments",0x12);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x70736e69;
  local_b8.field_2._M_local_buf[4] = 'e';
  local_b8.field_2._M_local_buf[5] = 'c';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'i';
  local_b8.field_2._8_2_ = 0x6e6f;
  local_b8._M_string_length = 10;
  local_b8.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x13;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"list embedded files",0x13);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x6d;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Show the key and stream number for each embedded file. Combine\nwith --verbose for more detailed information.\n"
         ,0x6d);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x11;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--show-attachment",0x11);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x70736e69;
  local_b8.field_2._M_local_buf[4] = 'e';
  local_b8.field_2._M_local_buf[5] = 'c';
  local_b8.field_2._M_local_buf[6] = 't';
  local_b8.field_2._M_local_buf[7] = 'i';
  local_b8.field_2._8_2_ = 0x6e6f;
  local_b8._M_string_length = 10;
  local_b8.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x17;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"export an embedded file",0x17);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x8e;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--show-attachment=key\n\nWrite the contents of the specified attachment to standard\noutput as binary data. Get the key with --list-attachments.\n"
         ,0x8e);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  paVar2 = &local_b8.field_2;
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_78._M_string_length = 4;
  local_78.field_2._M_local_buf[4] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x1f;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"JSON output for PDF information",0x1f);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x70;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Show information about the PDF file in JSON format. Please see the\nJSON chapter in the qpdf manual for details.\n"
         ,0x70);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x736a2d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'n';
  local_78._M_string_length = 6;
  local_78.field_2._M_local_buf[6] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x18;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"show file in JSON format",0x18);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x100;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--json[=version]\n\nGenerate a JSON representation of the file. This is described in\ndepth in the JSON section of the manual. \"version\" may be a\nspecific version or \"latest\" (the default). Run qpdf --json-help\nfor a description of the generated JSON object.\n"
         ,0x100);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x736a2d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'n';
  local_78.field_2._M_local_buf[6] = '-';
  local_78.field_2._M_local_buf[7] = 'h';
  local_78.field_2._M_local_buf[8] = 'e';
  local_78.field_2._M_local_buf[9] = 'l';
  local_78.field_2._M_local_buf[10] = 'p';
  local_78._M_string_length = 0xb;
  local_78.field_2._M_local_buf[0xb] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1a;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"show format of JSON output",0x1a);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xaa;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--json-help[=version]\n\nDescribe the format of the JSON output by writing to standard\noutput a JSON object with the same keys and with values\ncontaining descriptive text.\n"
         ,0xaa);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x736a2d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'n';
  local_78.field_2._M_local_buf[6] = '-';
  local_78.field_2._M_local_buf[7] = 'k';
  local_78.field_2._M_local_buf[8] = 'e';
  local_78.field_2._M_local_buf[9] = 'y';
  local_78._M_string_length = 10;
  local_78.field_2._M_local_buf[10] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x23;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"limit which keys are in JSON output",0x23);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xf5;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--json-key=key\n\nThis option is repeatable. If given, only the specified\ntop-level keys will be included in the JSON output. Otherwise,\nall keys will be included. With --json-output, when not given,\nonly the \"qpdf\" key will appear in the output.\n"
         ,0xf5);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x736a2d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'n';
  local_78.field_2._M_local_buf[6] = '-';
  local_78.field_2._M_local_buf[7] = 'o';
  local_78.field_2._M_local_buf[8] = 'b';
  local_78.field_2._M_local_buf[9] = 'j';
  local_78.field_2._M_local_buf[10] = 'e';
  local_78.field_2._M_local_buf[0xb] = 'c';
  local_78.field_2._M_local_buf[0xc] = 't';
  local_78._M_string_length = 0xd;
  local_78.field_2._M_local_buf[0xd] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1f;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"limit which objects are in JSON",0x1f);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xbc;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--json-object={trailer|obj[,gen]}\n\nThis option is repeatable. If given, only specified objects will\nbe shown in the \"objects\" key of the JSON output. Otherwise, all\nobjects will be shown.\n"
         ,0xbc);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x12;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--json-stream-data",0x12);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x24;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"how to handle streams in json output",0x24);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x1ce;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--json-stream-data={none|inline|file}\n\nWhen used with --json, this option controls whether streams in\njson output should be omitted, written inline (base64-encoded)\nor written to a file. If \"file\" is chosen, the file will be the\nname of the output file appended with -nnn where nnn is the\nobject number. The prefix can be overridden with\n--json-stream-prefix. The default is \"none\", except\nwhen --json-output is specified, in which case the default is\n\"inline\".\n"
         ,0x1ce);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x14;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--json-stream-prefix",0x14);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x21;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"prefix for json stream data files",0x21);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x15f;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--json-stream-prefix=file-prefix\n\nWhen used with --json-stream-data=file, --json-stream-data=file-prefix\nsets the prefix for stream data files, overriding the default,\nwhich is to use the output file name. Whatever is given here\nwill be appended with -nnn to create the name of the file that\nwill contain the data for the stream stream in object nnn.\n"
         ,0x15f);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x736a2d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'n';
  local_78.field_2._M_local_buf[6] = '-';
  local_78.field_2._M_local_buf[7] = 'o';
  local_78.field_2._M_local_buf[8] = 'u';
  local_78.field_2._M_local_buf[9] = 't';
  local_78.field_2._M_local_buf[10] = 'p';
  local_78.field_2._M_local_buf[0xb] = 'u';
  local_78.field_2._M_local_buf[0xc] = 't';
  local_78._M_string_length = 0xd;
  local_78.field_2._M_local_buf[0xd] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x25;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"apply defaults for JSON serialization",0x25);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x121;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--json-output[=version]\n\nImplies --json=version. Changes default values for certain\noptions so that the JSON output written is the most faithful\nrepresentation of the original PDF and contains no additional\nJSON keys. See also --json-stream-data, --json-stream-prefix,\nand --decode-level.\n"
         ,0x121);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x736a2d2d;
  local_78.field_2._M_local_buf[4] = 'o';
  local_78.field_2._M_local_buf[5] = 'n';
  local_78.field_2._M_local_buf[6] = '-';
  local_78.field_2._M_local_buf[7] = 'i';
  local_78.field_2._M_local_buf[8] = 'n';
  local_78.field_2._M_local_buf[9] = 'p';
  local_78.field_2._M_local_buf[10] = 'u';
  local_78.field_2._M_local_buf[0xb] = 't';
  local_78._M_string_length = 0xc;
  local_78.field_2._M_local_buf[0xc] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x17;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"input file is qpdf JSON",0x17);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x98;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Treat the input file as a JSON file in qpdf JSON format. See the\n\"qpdf JSON Format\" section of the manual for information about\nhow to use this option.\n"
         ,0x98);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x12;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--update-from-json",0x12);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x6e6f736a;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_local_buf[4] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1b;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"update a PDF from qpdf JSON",0x1b);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xa6;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--update-from-json=qpdf-json-file\n\nUpdate a PDF file from a JSON file. Please see the \"qpdf JSON\"\nchapter of the manual for information about how to use this\noption.\n"
         ,0xa6);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x74736574;
  local_78.field_2._M_local_buf[4] = 'i';
  local_78.field_2._M_local_buf[5] = 'n';
  local_78.field_2._M_local_buf[6] = 'g';
  local_78._M_string_length = 7;
  local_78.field_2._M_local_buf[7] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x20;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
  local_b8.field_2._M_allocated_capacity._0_4_ = SUB84(local_98._M_dataplus._M_p,0);
  local_b8.field_2._M_local_buf[4] = (char)((ulong)local_98._M_dataplus._M_p >> 0x20);
  local_b8.field_2._M_local_buf[5] = (char)((ulong)local_98._M_dataplus._M_p >> 0x28);
  local_b8.field_2._M_local_buf[6] = (char)((ulong)local_98._M_dataplus._M_p >> 0x30);
  local_b8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_b8._M_dataplus._M_p,"options for testing or debugging",0x20);
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x7f;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  local_98._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "The options below are useful when writing automated test code that\nincludes files created by qpdf or when testing qpdf itself.\n"
         ,0x7f);
  local_98._M_string_length = (size_type)_Var4._M_p;
  pcVar6[_Var4._M_p] = '\0';
  QPDFArgParser::addHelpTopic(ap,&local_78,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x74732d2d;
  local_78.field_2._M_local_buf[4] = 'a';
  local_78.field_2._M_local_buf[5] = 't';
  local_78.field_2._M_local_buf[6] = 'i';
  local_78.field_2._M_local_buf[7] = 'c';
  local_78.field_2._M_local_buf[8] = '-';
  local_78.field_2._M_local_buf[9] = 'i';
  local_78.field_2._M_local_buf[10] = 'd';
  local_78._M_string_length = 0xb;
  local_78.field_2._M_local_buf[0xb] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x74736574;
  local_b8.field_2._M_local_buf[4] = 'i';
  local_b8.field_2._M_local_buf[5] = 'n';
  local_b8.field_2._M_local_buf[6] = 'g';
  local_b8._M_string_length = 7;
  local_b8.field_2._M_local_buf[7] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x17;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"use a fixed document ID",0x17);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x96;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Use a fixed value for the document ID. This is intended for\ntesting only. Never use it for production files. See also\nqpdf --help=--deterministic-id.\n"
         ,0x96);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78.field_2._M_allocated_capacity._0_4_ = 0x74732d2d;
  local_78.field_2._M_local_buf[4] = 'a';
  local_78.field_2._M_local_buf[5] = 't';
  local_78.field_2._M_local_buf[6] = 'i';
  local_78.field_2._M_local_buf[7] = 'c';
  local_78.field_2._M_local_buf[8] = '-';
  local_78.field_2._M_local_buf[9] = 'a';
  local_78.field_2._M_local_buf[10] = 'e';
  local_78.field_2._M_local_buf[0xb] = 's';
  local_78.field_2._M_local_buf[0xc] = '-';
  local_78.field_2._M_local_buf[0xd] = 'i';
  local_78.field_2._M_local_buf[0xe] = 'v';
  local_78._M_string_length = 0xf;
  local_78.field_2._M_local_buf[0xf] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x74736574;
  local_b8.field_2._M_local_buf[4] = 'i';
  local_b8.field_2._M_local_buf[5] = 'n';
  local_b8.field_2._M_local_buf[6] = 'g';
  local_b8._M_string_length = 7;
  local_b8.field_2._M_local_buf[7] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x16;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"use a fixed AES vector",0x16);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xe8;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "Use a static initialization vector for AES-CBC. This is intended\nfor testing only so that output files can be reproducible. Never\nuse it for production files. This option is not secure since it\nsignificantly weakens the encryption.\n"
         ,0xe8);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x11;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--linearize-pass1",0x11);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x74736574;
  local_b8.field_2._M_local_buf[4] = 'i';
  local_b8.field_2._M_local_buf[5] = 'n';
  local_b8.field_2._M_local_buf[6] = 'g';
  local_b8._M_string_length = 7;
  local_b8.field_2._M_local_buf[7] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x1c;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"save pass 1 of linearization",0x1c);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0xac;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "--linearize-pass1=file\n\nWrite the first pass of linearization to the named file. The\nresulting file is not a valid PDF file. This option is useful only\nfor debugging qpdf.\n"
         ,0xac);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x12;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--test-json-schema",0x12);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x74736574;
  local_b8.field_2._M_local_buf[4] = 'i';
  local_b8.field_2._M_local_buf[5] = 'n';
  local_b8.field_2._M_local_buf[6] = 'g';
  local_b8._M_string_length = 7;
  local_b8.field_2._M_local_buf[7] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x22;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"test generated json against schema",0x22);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x7d;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "This is used by qpdf\'s test suite to check consistency between\nthe output of qpdf --json and the output of qpdf --json-help.\n"
         ,0x7d);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x15;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_b8);
  local_78.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_78.field_2._M_local_buf[4] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_78.field_2._M_local_buf[5] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x28);
  local_78.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"--report-memory-usage",0x15);
  local_78._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x74736574;
  local_b8.field_2._M_local_buf[4] = 'i';
  local_b8.field_2._M_local_buf[5] = 'n';
  local_b8.field_2._M_local_buf[6] = 'g';
  local_b8._M_string_length = 7;
  local_b8.field_2._M_local_buf[7] = '\0';
  local_58._M_dataplus._M_p = (pointer)0x22;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
  local_98.field_2._M_allocated_capacity._0_5_ = SUB85(local_58._M_dataplus._M_p,0);
  local_98.field_2._M_allocated_capacity._5_3_ =
       (undefined3)((ulong)local_58._M_dataplus._M_p >> 0x28);
  builtin_strncpy(local_98._M_dataplus._M_p,"best effort report of memory usage",0x22);
  local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_98._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = 0x75;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  sVar5 = local_38;
  local_58.field_2._M_allocated_capacity = local_38;
  local_58._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "This is used by qpdf\'s performance test suite to report the\nmaximum amount of memory used in supported environments.\n"
         ,0x75);
  local_58._M_string_length = sVar5;
  pcVar6[sVar5] = '\0';
  QPDFArgParser::addOptionHelp(ap,&local_78,&local_b8,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                             local_98.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             CONCAT16(local_b8.field_2._M_local_buf[6],
                                      CONCAT15(local_b8.field_2._M_local_buf[5],
                                               CONCAT14(local_b8.field_2._M_local_buf[4],
                                                        local_b8.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "For detailed help, visit the qpdf manual: https://qpdf.readthedocs.io\n","");
  QPDFArgParser::addHelpFooter(ap,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  return;
}

Assistant:

static void add_help(QPDFArgParser& ap)
{
    add_help_1(ap);
    add_help_2(ap);
    add_help_3(ap);
    add_help_4(ap);
    add_help_5(ap);
    add_help_6(ap);
    add_help_7(ap);
    add_help_8(ap);
ap.addHelpFooter("For detailed help, visit the qpdf manual: https://qpdf.readthedocs.io\n");
}